

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O1

int __thiscall QuadList<SSTableDataEntry>::init(QuadList<SSTableDataEntry> *this,EVP_PKEY_CTX *ctx)

{
  QuadListNode<SSTableDataEntry> *pQVar1;
  NodePosi pQVar2;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long *local_38;
  undefined8 uStack_30;
  long local_28 [2];
  
  pQVar2 = (NodePosi)operator_new(0x60);
  local_28[1] = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_30 = 0;
  local_28[0] = 0;
  *(undefined8 *)&pQVar2->data = 0;
  (pQVar2->data).timestamp = 0;
  (pQVar2->data).key = 0;
  (pQVar2->data).value_length = 0;
  (pQVar2->data).value._M_dataplus._M_p = (pointer)&(pQVar2->data).value.field_2;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)&(pQVar2->data).value,local_28,local_28);
  pQVar2->above = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->below = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  this->header = pQVar2;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  pQVar2 = (NodePosi)operator_new(0x60);
  uStack_60 = 0;
  local_68 = 0;
  *(undefined8 *)&pQVar2->data = 0;
  (pQVar2->data).timestamp = 0;
  (pQVar2->data).key = 0;
  (pQVar2->data).value_length = 0;
  (pQVar2->data).value._M_dataplus._M_p = (pointer)&(pQVar2->data).value.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&(pQVar2->data).value,&local_68,&local_68);
  pQVar2->above = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->below = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->pred = (QuadListNode<SSTableDataEntry> *)0x0;
  pQVar2->succ = (QuadListNode<SSTableDataEntry> *)0x0;
  this->trailer = pQVar2;
  pQVar2 = this->header;
  pQVar1 = this->trailer;
  pQVar2->succ = pQVar1;
  pQVar1->pred = pQVar2;
  return (int)pQVar2;
}

Assistant:

void QuadList<T>::init() {
    header = new Node();
    trailer = new Node();
    header->succ = trailer;
    trailer->pred = header;
}